

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O2

void __thiscall VDasher::dashHelper(VDasher *this,VPath *path,VPath *result)

{
  Element EVar1;
  model *pmVar2;
  pointer pEVar3;
  pointer cp1;
  Element *i;
  pointer pEVar4;
  
  this->mResult = result;
  pmVar2 = (path->d).mModel;
  VPath::reserve(result,(long)(pmVar2->mValue).m_points.
                              super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)(pmVar2->mValue).m_points.
                              super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3,
                 (long)(pmVar2->mValue).m_elements.
                       super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pmVar2->mValue).m_elements.
                       super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
                       super__Vector_impl_data._M_start);
  this->mIndex = 0;
  pmVar2 = (path->d).mModel;
  cp1 = (pmVar2->mValue).m_points.super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
        super__Vector_impl_data._M_start;
  pEVar4 = (pmVar2->mValue).m_elements.
           super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar3 = (pmVar2->mValue).m_elements.
           super__Vector_base<VPath::Element,_std::allocator<VPath::Element>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pEVar4 == pEVar3) {
      this->mResult = (VPath *)0x0;
      return;
    }
    EVar1 = *pEVar4;
    if (EVar1 == CubicTo) {
      cubicTo(this,cp1,cp1 + 1,cp1 + 2);
      cp1 = cp1 + 3;
    }
    else {
      if (EVar1 == LineTo) {
        lineTo(this,cp1);
      }
      else {
        if (EVar1 != MoveTo) goto LAB_0010b170;
        moveTo(this,cp1);
      }
      cp1 = cp1 + 1;
    }
LAB_0010b170:
    pEVar4 = pEVar4 + 1;
  } while( true );
}

Assistant:

void VDasher::dashHelper(const VPath &path, VPath &result)
{
    mResult = &result;
    mResult->reserve(path.points().size(), path.elements().size());
    mIndex = 0;
    const std::vector<VPath::Element> &elms = path.elements();
    const std::vector<VPointF> &       pts = path.points();
    const VPointF *                    ptPtr = pts.data();

    for (auto &i : elms) {
        switch (i) {
        case VPath::Element::MoveTo: {
            moveTo(*ptPtr++);
            break;
        }
        case VPath::Element::LineTo: {
            lineTo(*ptPtr++);
            break;
        }
        case VPath::Element::CubicTo: {
            cubicTo(*ptPtr, *(ptPtr + 1), *(ptPtr + 2));
            ptPtr += 3;
            break;
        }
        case VPath::Element::Close: {
            // The point is already joined to start point in VPath
            // no need to do anything here.
            break;
        }
        }
    }
    mResult = nullptr;
}